

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fASTCDecompressionCases.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::ASTCBlockSizeRemainderCase2D::iterate(ASTCBlockSizeRemainderCase2D *this)

{
  RenderContext *context;
  IVec2 log_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  deInt32 dVar4;
  deInt32 dVar5;
  ASTCSupportLevel AVar6;
  CompressedTexFormat format;
  int iVar7;
  undefined4 extraout_var;
  PixelFormat *this_00;
  deUint8 *dst;
  ASTCRenderer2D *pAVar8;
  ContextInfo *contextInfo;
  MessageBuilder *pMVar9;
  TestLog *log_01;
  bool local_581;
  MessageBuilder local_540;
  uint local_3c0;
  undefined1 local_3b9;
  int local_3b8;
  int iStack_3b4;
  bool compareOk;
  MessageBuilder local_3b0;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  ScopedLogSection local_150;
  ScopedLogSection section;
  TexDecompressionParams local_13c;
  undefined1 local_138 [8];
  Texture2D texture;
  Surface referenceFrame;
  Surface renderedFrame;
  AstcMode decompressionMode;
  undefined1 local_88 [8];
  CompressedTexture compressed;
  RGBA local_58;
  RGBA local_54;
  RenderContext *pRStack_50;
  RGBA threshold;
  RenderContext *renderCtx;
  int totalNumBlocks;
  int numBlocksY;
  int numBlocksX;
  int imageHeight;
  int imageWidth;
  int curRemainderY;
  int curRemainderX;
  IVec2 blockSize;
  TestLog *log;
  ASTCBlockSizeRemainderCase2D *this_local;
  
  blockSize.m_data =
       (int  [2])
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  de::details::
  UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
  ::operator->(&(this->m_renderer).
                super_UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
              );
  ASTCDecompressionCaseInternal::ASTCRenderer2D::getBlockSize((ASTCRenderer2D *)&curRemainderY);
  iVar3 = this->m_currentIteration;
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&curRemainderY);
  imageWidth = iVar3 % iVar2;
  iVar3 = this->m_currentIteration;
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&curRemainderY);
  imageHeight = iVar3 / iVar2;
  iVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&curRemainderY);
  numBlocksX = iVar3 * 4 + imageWidth;
  iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&curRemainderY);
  iVar3 = numBlocksX;
  numBlocksY = iVar2 * 4 + imageHeight;
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&curRemainderY);
  dVar4 = deDivRoundUp32(iVar3,iVar2);
  iVar3 = numBlocksY;
  iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&curRemainderY);
  dVar5 = deDivRoundUp32(iVar3,iVar2);
  pRStack_50 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRStack_50->_vptr_RenderContext[4])();
  this_00 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar3));
  local_58 = tcu::PixelFormat::getColorThreshold(this_00);
  bVar1 = tcu::isAstcSRGBFormat(this->m_format);
  if (bVar1) {
    tcu::RGBA::RGBA((RGBA *)((long)&compressed.m_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),2,2,2,2)
    ;
  }
  else {
    tcu::RGBA::RGBA((RGBA *)((long)&compressed.m_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),1,1,1,1)
    ;
  }
  local_54 = tcu::operator+(&local_58,
                            (RGBA *)((long)&compressed.m_data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
  ;
  tcu::CompressedTexture::CompressedTexture
            ((CompressedTexture *)local_88,this->m_format,numBlocksX,numBlocksY,1);
  dst = (deUint8 *)tcu::CompressedTexture::getData((CompressedTexture *)local_88);
  iVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&curRemainderY);
  iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&curRemainderY);
  tcu::astc::generateDummyNormalBlocks(dst,(long)(dVar4 * dVar5),iVar3,iVar2);
  pAVar8 = de::details::
           UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
           ::operator->(&(this->m_renderer).
                         super_UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
                       );
  AVar6 = ASTCDecompressionCaseInternal::ASTCRenderer2D::getASTCSupport(pAVar8);
  local_581 = true;
  if (AVar6 != ASTCSUPPORTLEVEL_LDR) {
    local_581 = tcu::isAstcSRGBFormat(this->m_format);
  }
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,numBlocksX,numBlocksY);
  tcu::Surface::Surface((Surface *)&texture.m_glTexture,numBlocksX,numBlocksY);
  context = pRStack_50;
  contextInfo = gles3::Context::getContextInfo((this->super_TestCase).m_context);
  tcu::TexDecompressionParams::TexDecompressionParams(&local_13c,(byte)~local_581 & ASTCMODE_HDR);
  glu::Texture2D::Texture2D
            ((Texture2D *)local_138,context,contextInfo,1,(CompressedTexture *)local_88,&local_13c);
  pAVar8 = de::details::
           UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
           ::operator->(&(this->m_renderer).
                         super_UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
                       );
  format = tcu::CompressedTexture::getFormat((CompressedTexture *)local_88);
  register0x00000000 = tcu::getUncompressedFormat(format);
  ASTCDecompressionCaseInternal::ASTCRenderer2D::render
            (pAVar8,(Surface *)&texture.m_glTexture,(Surface *)&referenceFrame.m_pixels.m_cap,
             (Texture2D *)local_138,(TextureFormat *)((long)&section.m_log + 4));
  log_00 = blockSize;
  de::toString<int>(&local_190,&this->m_currentIteration);
  std::operator+(&local_170,"Iteration ",&local_190);
  de::toString<int>(&local_210,&imageWidth);
  std::operator+(&local_1f0,"Remainder ",&local_210);
  std::operator+(&local_1d0,&local_1f0,"x");
  de::toString<int>(&local_230,&imageHeight);
  std::operator+(&local_1b0,&local_1d0,&local_230);
  tcu::ScopedLogSection::ScopedLogSection(&local_150,(TestLog *)log_00.m_data,&local_170,&local_1b0)
  ;
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  tcu::TestLog::operator<<
            (&local_3b0,(TestLog *)blockSize.m_data,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_3b0,(char (*) [23])"Using texture of size ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&numBlocksX);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2a9098a);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&numBlocksY);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])" and block size ");
  iStack_3b4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&curRemainderY);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&stack0xfffffffffffffc4c);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2a9098a);
  local_3b8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&curRemainderY);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_3b8);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [30])"; the x and y remainders are ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&imageWidth);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [6])0x2b82e30);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&imageHeight);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])0x2bf790d);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3b0);
  log_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = tcu::pixelThresholdCompare
                    (log_01,"ComparisonResult","Comparison Result",(Surface *)&texture.m_glTexture,
                     (Surface *)&referenceFrame.m_pixels.m_cap,&local_54,
                     COMPARE_LOG_ON_ERROR - (this->m_currentIteration == 0));
  local_3b9 = bVar1;
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
    this_local._4_4_ = STOP;
  }
  local_3c0 = (uint)!bVar1;
  tcu::ScopedLogSection::~ScopedLogSection(&local_150);
  if (local_3c0 == 0) {
    if (this->m_currentIteration == 0) {
      iVar3 = this->m_currentIteration;
      iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&curRemainderY);
      iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&curRemainderY);
      if (iVar3 + 1 < iVar2 * iVar7) {
        tcu::TestLog::operator<<
                  (&local_540,(TestLog *)blockSize.m_data,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_540,
                            (char (*) [67])
                            "Note: not logging further images unless reference comparison fails");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_540);
      }
    }
    this->m_currentIteration = this->m_currentIteration + 1;
    iVar3 = this->m_currentIteration;
    iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&curRemainderY);
    iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&curRemainderY);
    if (iVar3 < iVar2 * iVar7) {
      this_local._4_4_ = CONTINUE;
      local_3c0 = 1;
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      this_local._4_4_ = STOP;
      local_3c0 = 1;
    }
  }
  glu::Texture2D::~Texture2D((Texture2D *)local_138);
  tcu::Surface::~Surface((Surface *)&texture.m_glTexture);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  tcu::CompressedTexture::~CompressedTexture((CompressedTexture *)local_88);
  return this_local._4_4_;
}

Assistant:

ASTCBlockSizeRemainderCase2D::IterateResult ASTCBlockSizeRemainderCase2D::iterate (void)
{
	TestLog&						log						= m_testCtx.getLog();
	const IVec2						blockSize				= m_renderer->getBlockSize();
	const int						curRemainderX			= m_currentIteration % blockSize.x();
	const int						curRemainderY			= m_currentIteration / blockSize.x();
	const int						imageWidth				= (MAX_NUM_BLOCKS_X-1)*blockSize.x() + curRemainderX;
	const int						imageHeight				= (MAX_NUM_BLOCKS_Y-1)*blockSize.y() + curRemainderY;
	const int						numBlocksX				= deDivRoundUp32(imageWidth, blockSize.x());
	const int						numBlocksY				= deDivRoundUp32(imageHeight, blockSize.y());
	const int						totalNumBlocks			= numBlocksX * numBlocksY;
	const glu::RenderContext&		renderCtx				= m_context.getRenderContext();
	const tcu::RGBA					threshold				= renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + (tcu::isAstcSRGBFormat(m_format) ? tcu::RGBA(2,2,2,2) : tcu::RGBA(1,1,1,1));
	tcu::CompressedTexture			compressed				(m_format, imageWidth, imageHeight);

	DE_ASSERT(compressed.getDataSize() == totalNumBlocks*tcu::astc::BLOCK_SIZE_BYTES);
	tcu::astc::generateDummyNormalBlocks((deUint8*)compressed.getData(), totalNumBlocks, blockSize.x(), blockSize.y());

	// Create texture and render.

	const tcu::TexDecompressionParams::AstcMode	decompressionMode	= (m_renderer->getASTCSupport() == ASTCSUPPORTLEVEL_LDR || tcu::isAstcSRGBFormat(m_format))
																	? tcu::TexDecompressionParams::ASTCMODE_LDR
																	: tcu::TexDecompressionParams::ASTCMODE_HDR;
	Surface										renderedFrame		(imageWidth, imageHeight);
	Surface										referenceFrame		(imageWidth, imageHeight);
	glu::Texture2D								texture				(renderCtx, m_context.getContextInfo(), 1, &compressed, tcu::TexDecompressionParams(decompressionMode));

	m_renderer->render(referenceFrame, renderedFrame, texture, getUncompressedFormat(compressed.getFormat()));

	{
		// Compare and log.

		tcu::ScopedLogSection section(log, "Iteration " + de::toString(m_currentIteration),
										   "Remainder " + de::toString(curRemainderX) + "x" + de::toString(curRemainderY));

		log << TestLog::Message << "Using texture of size "
								<< imageWidth << "x" << imageHeight
								<< " and block size "
								<< blockSize.x() << "x" << blockSize.y()
								<< "; the x and y remainders are "
								<< curRemainderX << " and " << curRemainderY << " respectively"
			<< TestLog::EndMessage;

		const bool compareOk = tcu::pixelThresholdCompare(m_testCtx.getLog(), "ComparisonResult", "Comparison Result", referenceFrame, renderedFrame, threshold,
														  m_currentIteration == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

		if (!compareOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
			return STOP;
		}
	}

	if (m_currentIteration == 0 && m_currentIteration+1 < blockSize.x()*blockSize.y())
		log << TestLog::Message << "Note: not logging further images unless reference comparison fails" << TestLog::EndMessage;

	m_currentIteration++;

	if (m_currentIteration >= blockSize.x()*blockSize.y())
	{
		DE_ASSERT(m_currentIteration == blockSize.x()*blockSize.y());
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}
	return CONTINUE;
}